

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O1

int __thiscall chrono::ChFunction_Sequence::HandleNumber(ChFunction_Sequence *this)

{
  int iVar1;
  _List_node_base *p_Var2;
  
  iVar1 = 0;
  p_Var2 = (_List_node_base *)&this->functions;
  do {
    p_Var2 = (((_List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *)
              &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    iVar1 = iVar1 + 1;
  } while (p_Var2 != (_List_node_base *)&this->functions);
  return iVar1;
}

Assistant:

int ChFunction_Sequence::HandleNumber() const {
    int tot = 1;
    for (auto iter = functions.begin(); iter != functions.end(); ++iter) {
        tot++;
    }
    return tot;
}